

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

void Abc_NtkWriteAig(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  FILE *__s;
  Vec_Int_t *p;
  int *piVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x2d3,"void Abc_NtkWriteAig(Abc_Ntk_t *, char *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x2d4,"void Abc_NtkWriteAig(Abc_Ntk_t *, char *)");
  }
  __s = _stdout;
  if (pFileName != (char *)0x0) {
    __s = fopen(pFileName,"w");
  }
  if (__s == (FILE *)0x0) {
    puts("Cannot open output file.");
    return;
  }
  iVar7 = pNtk->vObjs->nSize;
  iVar6 = iVar7 * 2;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar7 * 2 - 1U) {
    iVar5 = iVar6;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  iVar7 = 0;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar2;
  Vec_IntFill(p,iVar6,-1);
  pAVar3 = Abc_AigConst1(pNtk);
  Vec_IntWriteEntry(p,pAVar3->Id * 2 + 1,0);
  pAVar3 = Abc_AigConst1(pNtk);
  Vec_IntWriteEntry(p,pAVar3->Id * 2,1);
  iVar6 = 2;
  for (; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkPi(pNtk,iVar7);
    iVar5 = iVar6 + 1;
    Vec_IntWriteEntry(p,pAVar3->Id * 2,iVar6);
    iVar6 = iVar6 + 2;
    Vec_IntWriteEntry(p,pAVar3->Id * 2 + 1,iVar5);
  }
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar7);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar5 = Abc_AigNodeIsAnd(pAVar3), iVar5 != 0)) {
      iVar5 = iVar6 + 1;
      Vec_IntWriteEntry(p,pAVar3->Id * 2,iVar6);
      iVar6 = iVar6 + 2;
      Vec_IntWriteEntry(p,pAVar3->Id * 2 + 1,iVar5);
    }
  }
  fwrite("{\n",2,1,__s);
  fprintf(__s,"    \"%s\", ",pNtk->pName);
  fprintf(__s,"//  pi=%d  po=%d  and=%d",(ulong)(uint)pNtk->vPis->nSize,
          (ulong)(uint)pNtk->vPos->nSize,(ulong)(uint)pNtk->nObjCounts[7]);
  fputc(10,__s);
  fwrite("    { ",6,1,__s);
  for (iVar7 = 0; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkPi(pNtk,iVar7);
    pcVar4 = Abc_ObjName(pAVar3);
    fprintf(__s,"\"%s\",",pcVar4);
  }
  fwrite("NULL },\n",8,1,__s);
  fwrite("    { ",6,1,__s);
  for (iVar7 = 0; iVar7 < pNtk->vPos->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkPo(pNtk,iVar7);
    pcVar4 = Abc_ObjName(pAVar3);
    fprintf(__s,"\"%s\",",pcVar4);
  }
  fwrite("NULL },\n",8,1,__s);
  fwrite("    { ",6,1,__s);
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar7);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar6 = Abc_AigNodeIsAnd(pAVar3), iVar6 != 0)) {
      uVar1 = Vec_IntEntry(p,(*(uint *)&pAVar3->field_0x14 >> 10 & 1) +
                             *(pAVar3->vFanins).pArray * 2);
      fprintf(__s,"%d,",(ulong)uVar1);
    }
  }
  fwrite("0 },\n",5,1,__s);
  fwrite("    { ",6,1,__s);
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar7);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar6 = Abc_AigNodeIsAnd(pAVar3), iVar6 != 0)) {
      uVar1 = Vec_IntEntry(p,(*(uint *)&pAVar3->field_0x14 >> 0xb & 1) +
                             (pAVar3->vFanins).pArray[1] * 2);
      fprintf(__s,"%d,",(ulong)uVar1);
    }
  }
  fwrite("0 },\n",5,1,__s);
  fwrite("    { ",6,1,__s);
  for (iVar7 = 0; iVar7 < pNtk->vPos->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkPo(pNtk,iVar7);
    uVar1 = Vec_IntEntry(p,(*(uint *)&pAVar3->field_0x14 >> 10 & 1) + *(pAVar3->vFanins).pArray * 2)
    ;
    fprintf(__s,"%d,",(ulong)uVar1);
  }
  fwrite("0 },\n",5,1,__s);
  fwrite("},\n",3,1,__s);
  if (__s != _stdout) {
    fclose(__s);
  }
  free(p->pArray);
  free(p);
  return;
}

Assistant:

void Abc_NtkWriteAig( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Vec_Int_t * vId2Num;
    Abc_Obj_t * pObj;
    int i, iLit;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    if ( pFileName == NULL )
        pFile = stdout;
    else
        pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return;
    }
    vId2Num = Vec_IntAlloc( 2*Abc_NtkObjNumMax(pNtk) );
    Vec_IntFill( vId2Num, 2*Abc_NtkObjNumMax(pNtk), -1 );

    iLit = 0;
    Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(Abc_AigConst1(pNtk))+1, iLit++ );
    Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(Abc_AigConst1(pNtk))+0, iLit++ );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+0, iLit++ );
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+1, iLit++ );
    }
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+0, iLit++ );
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+1, iLit++ );
    }
    fprintf( pFile, "{\n" );
    fprintf( pFile, "    \"%s\", ", Abc_NtkName(pNtk) );
    fprintf( pFile, "//  pi=%d  po=%d  and=%d", Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk), Abc_NtkNodeNum(pNtk) );
    fprintf( pFile, "\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "\"%s\",", Abc_ObjName(pObj) );
    fprintf( pFile, "NULL },\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "\"%s\",", Abc_ObjName(pObj) );
    fprintf( pFile, "NULL },\n" );
    fprintf( pFile, "    { " );
    Abc_AigForEachAnd( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId0(pObj) + Abc_ObjFaninC0(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "    { " );
    Abc_AigForEachAnd( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId1(pObj) + Abc_ObjFaninC1(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId0(pObj) + Abc_ObjFaninC0(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "},\n" );
    if ( pFile != stdout )
        fclose( pFile );
    Vec_IntFree( vId2Num );
}